

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libunicode.c
# Opt level: O1

int cr_realloc(CharRange *cr,int size)

{
  uint32_t *puVar1;
  int iVar2;
  
  iVar2 = 0;
  if (cr->size < size) {
    iVar2 = (cr->size * 3) / 2;
    if (iVar2 < size) {
      iVar2 = size;
    }
    puVar1 = (uint32_t *)(*cr->realloc_func)(cr->mem_opaque,cr->points,(long)iVar2 << 2);
    if (puVar1 == (uint32_t *)0x0) {
      iVar2 = -1;
    }
    else {
      cr->points = puVar1;
      cr->size = iVar2;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int cr_realloc(CharRange *cr, int size)
{
    int new_size;
    uint32_t *new_buf;
    
    if (size > cr->size) {
        new_size = max_int(size, cr->size * 3 / 2);
        new_buf = cr->realloc_func(cr->mem_opaque, cr->points,
                                   new_size * sizeof(cr->points[0]));
        if (!new_buf)
            return -1;
        cr->points = new_buf;
        cr->size = new_size;
    }
    return 0;
}